

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_file.cpp
# Opt level: O2

BOOL SetEndOfFile(HANDLE hFile)

{
  PAL_ERROR PVar1;
  CPalThread *pThread;
  PAL_ERROR *pPVar2;
  
  if (PAL_InitializeChakraCoreCalled) {
    pThread = CorUnix::InternalGetCurrentThread();
    PVar1 = CorUnix::InternalSetEndOfFile(pThread,hFile);
    if (PVar1 != 0) {
      pPVar2 = (PAL_ERROR *)__errno_location();
      *pPVar2 = PVar1;
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return (BOOL)(PVar1 == 0);
    }
  }
  abort();
}

Assistant:

BOOL
PALAPI
SetEndOfFile(
         IN HANDLE hFile)
{
    PAL_ERROR palError = NO_ERROR;
    CPalThread *pThread;;

    PERF_ENTRY(SetEndOfFile);
    ENTRY("SetEndOfFile(hFile=%p)\n", hFile);

    pThread = InternalGetCurrentThread();

    palError = InternalSetEndOfFile(
        pThread,
        hFile
        );

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }

    LOGEXIT("SetEndOfFile returns BOOL %d\n", NO_ERROR == palError);
    PERF_EXIT(SetEndOfFile);
    return NO_ERROR == palError;
}